

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::anon_unknown_6::ReportReflectionUsageTypeError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,CppType expected_type)

{
  char *pcVar1;
  LogMessage *pLVar2;
  string_view str;
  string_view str_00;
  string_view v;
  string_view str_01;
  string_view v_00;
  string_view str_02;
  string_view str_03;
  LogMessage LStack_38;
  char *local_28;
  
  local_28 = method;
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xf5);
  str._M_str = 
  "Protocol Buffer reflection usage error:\n  Method      : google::protobuf::Reflection::";
  str._M_len = 0x56;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_38,str);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (&LStack_38,&local_28);
  str_00._M_str = "\n  Message type: ";
  str_00._M_len = 0x11;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_00);
  pcVar1 = (descriptor->all_names_).payload_;
  v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v._M_str = pcVar1 + ~v._M_len;
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
  str_01._M_str = "\n  Field       : ";
  str_01._M_len = 0x11;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_01);
  pcVar1 = (field->all_names_).payload_;
  v_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
  v_00._M_str = pcVar1 + ~v_00._M_len;
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v_00);
  str_02._M_str =
       "\n  Problem     : Field is not the right type for this message:\n    Expected  : ";
  str_02._M_len = 0x4f;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_02);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar2,(char **)(protobuf::(anonymous_namespace)::cpptype_names_ +
                                      (ulong)expected_type * 8));
  str_03._M_str = "\n    Field type: ";
  str_03._M_len = 0x11;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_03);
  absl::lts_20250127::log_internal::LogMessage::operator<<<const_char_*,_0>
            (pLVar2,(char **)(protobuf::(anonymous_namespace)::cpptype_names_ +
                             (ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                             (ulong)field->type_ * 4) * 8));
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

static void ReportReflectionUsageTypeError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, FieldDescriptor::CppType expected_type) {
  ABSL_LOG(FATAL)
      << "Protocol Buffer reflection usage error:\n"
         "  Method      : google::protobuf::Reflection::"
      << method
      << "\n"
         "  Message type: "
      << descriptor->full_name()
      << "\n"
         "  Field       : "
      << field->full_name()
      << "\n"
         "  Problem     : Field is not the right type for this message:\n"
         "    Expected  : "
      << cpptype_names_[expected_type]
      << "\n"
         "    Field type: "
      << cpptype_names_[field->cpp_type()];
}